

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugLine::Prologue::dump(Prologue *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  ushort uVar1;
  Prologue *pPVar2;
  raw_ostream *prVar3;
  pointer pDVar4;
  pointer pFVar5;
  raw_ostream *prVar6;
  pointer pDVar7;
  uint uVar8;
  pointer pFVar9;
  ulong uVar10;
  StringRef SVar11;
  format_object_base local_118;
  uint8_t local_108;
  format_object_base local_100;
  uint8_t local_f0;
  format_object_base local_e8;
  int8_t local_d8;
  format_object_base local_d0;
  uint8_t local_c0;
  format_object_base local_b8;
  uint8_t local_a8;
  format_object_base local_a0;
  uint16_t local_90;
  ulong local_88;
  _func_int **local_80;
  Prologue *local_78;
  _func_int **local_70;
  undefined1 local_68 [16];
  uint64_t local_58;
  char *local_50;
  raw_ostream *local_38;
  
  prVar3 = raw_ostream::operator<<(OS,"Line table prologue:\n");
  local_68._8_8_ = "    total_length: 0x%8.8lx\n";
  local_70 = (_func_int **)&PTR_home_01127cf0;
  local_68._0_8_ = &PTR_home_01127cf0;
  local_58 = this->TotalLength;
  prVar3 = raw_ostream::operator<<(prVar3,(format_object_base *)local_68);
  local_90 = (this->FormParams).Version;
  local_a0.Fmt = "         version: %u\n";
  local_a0._vptr_format_object_base = (_func_int **)&PTR_home_01127df8;
  raw_ostream::operator<<(prVar3,&local_a0);
  local_38 = OS;
  if (4 < (this->FormParams).Version) {
    local_68._8_8_ = "    address_size: %u\n";
    local_68._0_8_ = &PTR_home_01127e18;
    local_58 = CONCAT71(local_58._1_7_,(this->FormParams).AddrSize);
    prVar3 = raw_ostream::operator<<(OS,(format_object_base *)local_68);
    OS = local_38;
    local_a0.Fmt = " seg_select_size: %u\n";
    local_a0._vptr_format_object_base = (_func_int **)&PTR_home_01127e18;
    local_90 = CONCAT11(local_90._1_1_,this->SegSelectorSize);
    raw_ostream::operator<<(prVar3,&local_a0);
  }
  local_68._8_8_ = " prologue_length: 0x%8.8lx\n";
  local_68._0_8_ = local_70;
  local_58 = this->PrologueLength;
  prVar3 = raw_ostream::operator<<(OS,(format_object_base *)local_68);
  local_a0.Fmt = " min_inst_length: %u\n";
  local_a0._vptr_format_object_base = (_func_int **)&PTR_home_01127e18;
  local_90 = CONCAT11(local_90._1_1_,this->MinInstLength);
  prVar3 = raw_ostream::operator<<(prVar3,&local_a0);
  local_118.Fmt = "";
  if (3 < (this->FormParams).Version) {
    local_118.Fmt = "max_ops_per_inst: %u\n";
  }
  local_118._vptr_format_object_base = (_func_int **)&PTR_home_01127e18;
  local_108 = this->MaxOpsPerInst;
  prVar3 = raw_ostream::operator<<(prVar3,&local_118);
  local_100.Fmt = " default_is_stmt: %u\n";
  local_100._vptr_format_object_base = (_func_int **)&PTR_home_01127e18;
  local_f0 = this->DefaultIsStmt;
  prVar3 = raw_ostream::operator<<(prVar3,&local_100);
  local_e8.Fmt = "       line_base: %i\n";
  local_e8._vptr_format_object_base = (_func_int **)&PTR_home_01128298;
  local_d8 = this->LineBase;
  prVar3 = raw_ostream::operator<<(prVar3,&local_e8);
  local_d0.Fmt = "      line_range: %u\n";
  local_d0._vptr_format_object_base = (_func_int **)&PTR_home_01127e18;
  local_c0 = this->LineRange;
  prVar3 = raw_ostream::operator<<(prVar3,&local_d0);
  local_b8.Fmt = "     opcode_base: %u\n";
  local_b8._vptr_format_object_base = (_func_int **)&PTR_home_01127e18;
  local_a8 = this->OpcodeBase;
  raw_ostream::operator<<(prVar3,&local_b8);
  for (uVar8 = 1; prVar3 = local_38,
      (long)(this->StandardOpcodeLengths).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->StandardOpcodeLengths).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ulong)(uVar8 - 1); uVar8 = uVar8 + 1) {
    SVar11 = dwarf::LNStandardString(uVar8);
    local_50 = SVar11.Data;
    local_68._8_8_ = "standard_opcode_lengths[%s] = %u\n";
    local_68._0_8_ = &PTR_home_011282b8;
    local_58 = CONCAT71(local_58._1_7_,
                        (this->StandardOpcodeLengths).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8 - 1]);
    raw_ostream::operator<<(local_38,(format_object_base *)local_68);
  }
  pDVar7 = (this->IncludeDirectories).
           super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar4 = (this->IncludeDirectories).
           super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar7 != pDVar4) {
    uVar1 = (this->FormParams).Version;
    uVar8 = 0;
    while( true ) {
      if (((long)pDVar4 - (long)pDVar7) / 0x30 == (ulong)uVar8) break;
      local_68._8_8_ = "include_directories[%3u] = ";
      local_68._0_8_ = &PTR_home_01127cd0;
      local_58 = CONCAT44(local_58._4_4_,uVar8 + (uVar1 < 5));
      raw_ostream::operator<<(prVar3,(format_object_base *)local_68);
      DWARFFormValue::dump
                ((this->IncludeDirectories).
                 super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar8,prVar3,DumpOptions);
      raw_ostream::operator<<(prVar3,'\n');
      uVar8 = uVar8 + 1;
      pDVar7 = (this->IncludeDirectories).
               super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar4 = (this->IncludeDirectories).
               super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  prVar3 = local_38;
  pFVar9 = (this->FileNames).
           super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar5 = (this->FileNames).
           super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar9 != pFVar5) {
    local_88 = (ulong)((this->FormParams).Version < 5);
    uVar8 = 0;
    local_80 = (_func_int **)&PTR_home_01127cd0;
    local_78 = this;
    while (uVar10 = (ulong)uVar8, ((long)pFVar5 - (long)pFVar9) / 0x88 != uVar10) {
      pFVar5 = pFVar9 + uVar10;
      local_68._8_8_ = "file_names[%3u]:\n";
      local_68._0_8_ = local_80;
      local_58 = CONCAT44(local_58._4_4_,(int)local_88 + uVar8);
      raw_ostream::operator<<(prVar3,(format_object_base *)local_68);
      raw_ostream::operator<<(prVar3,"           name: ");
      DWARFFormValue::dump(&pFVar5->Name,prVar3,DumpOptions);
      prVar6 = raw_ostream::operator<<(prVar3,'\n');
      local_68._8_8_ = "      dir_index: %lu\n";
      local_68._0_8_ = local_70;
      local_58 = pFVar9[uVar10].DirIdx;
      raw_ostream::operator<<(prVar6,(format_object_base *)local_68);
      pPVar2 = local_78;
      if ((local_78->ContentTypes).HasMD5 == true) {
        prVar6 = raw_ostream::operator<<(prVar3,"   md5_checksum: ");
        MD5::MD5Result::digest((SmallString<32U> *)local_68,&pFVar5->Checksum);
        prVar6 = raw_ostream::operator<<(prVar6,(SmallVectorImpl<char> *)local_68);
        raw_ostream::operator<<(prVar6,'\n');
        SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_68);
      }
      if ((pPVar2->ContentTypes).HasModTime == true) {
        local_68._8_8_ = "       mod_time: 0x%8.8lx\n";
        local_68._0_8_ = local_70;
        local_58 = pFVar5->ModTime;
        raw_ostream::operator<<(prVar3,(format_object_base *)local_68);
      }
      if ((pPVar2->ContentTypes).HasLength == true) {
        local_68._8_8_ = "         length: 0x%8.8lx\n";
        local_68._0_8_ = local_70;
        local_58 = pFVar5->Length;
        raw_ostream::operator<<(prVar3,(format_object_base *)local_68);
      }
      if ((pPVar2->ContentTypes).HasSource == true) {
        raw_ostream::operator<<(prVar3,"         source: ");
        DWARFFormValue::dump(&pFVar5->Source,prVar3,DumpOptions);
        raw_ostream::operator<<(prVar3,'\n');
      }
      uVar8 = uVar8 + 1;
      pFVar9 = (pPVar2->FileNames).
               super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar5 = (pPVar2->FileNames).
               super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::Prologue::dump(raw_ostream &OS,
                                    DIDumpOptions DumpOptions) const {
  OS << "Line table prologue:\n"
     << format("    total_length: 0x%8.8" PRIx64 "\n", TotalLength)
     << format("         version: %u\n", getVersion());
  if (getVersion() >= 5)
    OS << format("    address_size: %u\n", getAddressSize())
       << format(" seg_select_size: %u\n", SegSelectorSize);
  OS << format(" prologue_length: 0x%8.8" PRIx64 "\n", PrologueLength)
     << format(" min_inst_length: %u\n", MinInstLength)
     << format(getVersion() >= 4 ? "max_ops_per_inst: %u\n" : "", MaxOpsPerInst)
     << format(" default_is_stmt: %u\n", DefaultIsStmt)
     << format("       line_base: %i\n", LineBase)
     << format("      line_range: %u\n", LineRange)
     << format("     opcode_base: %u\n", OpcodeBase);

  for (uint32_t I = 0; I != StandardOpcodeLengths.size(); ++I)
    OS << format("standard_opcode_lengths[%s] = %u\n",
                 LNStandardString(I + 1).data(), StandardOpcodeLengths[I]);

  if (!IncludeDirectories.empty()) {
    // DWARF v5 starts directory indexes at 0.
    uint32_t DirBase = getVersion() >= 5 ? 0 : 1;
    for (uint32_t I = 0; I != IncludeDirectories.size(); ++I) {
      OS << format("include_directories[%3u] = ", I + DirBase);
      IncludeDirectories[I].dump(OS, DumpOptions);
      OS << '\n';
    }
  }

  if (!FileNames.empty()) {
    // DWARF v5 starts file indexes at 0.
    uint32_t FileBase = getVersion() >= 5 ? 0 : 1;
    for (uint32_t I = 0; I != FileNames.size(); ++I) {
      const FileNameEntry &FileEntry = FileNames[I];
      OS <<   format("file_names[%3u]:\n", I + FileBase);
      OS <<          "           name: ";
      FileEntry.Name.dump(OS, DumpOptions);
      OS << '\n'
         <<   format("      dir_index: %" PRIu64 "\n", FileEntry.DirIdx);
      if (ContentTypes.HasMD5)
        OS <<        "   md5_checksum: " << FileEntry.Checksum.digest() << '\n';
      if (ContentTypes.HasModTime)
        OS << format("       mod_time: 0x%8.8" PRIx64 "\n", FileEntry.ModTime);
      if (ContentTypes.HasLength)
        OS << format("         length: 0x%8.8" PRIx64 "\n", FileEntry.Length);
      if (ContentTypes.HasSource) {
        OS <<        "         source: ";
        FileEntry.Source.dump(OS, DumpOptions);
        OS << '\n';
      }
    }
  }
}